

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall Js::LoopEntryPointInfo::OnCleanup(LoopEntryPointInfo *this,bool isShutdown)

{
  Type *pp_Var1;
  JavascriptMethod p_Var2;
  State SVar3;
  JavascriptMethod p_Var4;
  
  SVar3 = EntryPointInfo::GetState(&this->super_EntryPointInfo);
  if ((SVar3 == CodeGenDone) && (((this->super_EntryPointInfo).field_0x18 & 0x20) == 0)) {
    p_Var2 = (JavascriptMethod)(this->super_EntryPointInfo).super_ProxyEntryPointInfo.jsMethod;
    p_Var4 = EntryPointInfo::GetNativeEntrypoint(&this->super_EntryPointInfo);
    if (p_Var2 == p_Var4) {
      pp_Var1 = &(this->super_EntryPointInfo).super_ProxyEntryPointInfo.jsMethod;
      *(byte *)pp_Var1 = *(byte *)pp_Var1 | 1;
    }
  }
  return;
}

Assistant:

void LoopEntryPointInfo::OnCleanup(bool isShutdown)
    {
#ifdef ASMJS_PLAT
        if (this->IsCodeGenDone() && !this->GetIsTJMode())
#else
        if (this->IsCodeGenDone())
#endif
        {
            JS_ETW(EtwTrace::LogLoopBodyUnloadEvent(this->loopHeader->functionBody, this,
                this->loopHeader->functionBody->GetLoopNumber(this->loopHeader)));

#if ENABLE_NATIVE_CODEGEN
            this->CleanupNativeCode(this->loopHeader->functionBody->GetScriptContext());
#endif
        }
    }